

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O3

void PVG_FT_Vector_Polarize(PVG_FT_Vector *vec,PVG_FT_Fixed *length,PVG_FT_Angle *angle)

{
  uint uVar1;
  PVG_FT_Fixed s;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  int iVar8;
  PVG_FT_Vector local_38;
  long lVar7;
  
  local_38.x = vec->x;
  lVar3 = vec->y;
  if (local_38.x != 0 || lVar3 != 0) {
    lVar4 = -local_38.x;
    if (0 < local_38.x) {
      lVar4 = local_38.x;
    }
    lVar7 = -lVar3;
    if (0 < lVar3) {
      lVar7 = lVar3;
    }
    uVar6 = (uint)lVar7 | (uint)lVar4;
    uVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (uVar1 < 0x1e) {
      iVar8 = 0x1d - uVar1;
      local_38.x = local_38.x << ((byte)iVar8 & 0x3f);
      local_38.y = lVar3 << ((byte)iVar8 & 0x3f);
    }
    else {
      iVar8 = (uVar1 ^ 0x1f) - 2;
      bVar2 = 2 - (char)(uVar1 ^ 0x1f);
      local_38.x = local_38.x >> (bVar2 & 0x3f);
      local_38.y = lVar3 >> (bVar2 & 0x3f);
    }
    ft_trig_pseudo_polarize(&local_38);
    lVar3 = -local_38.x;
    if (0 < local_38.x) {
      lVar3 = local_38.x;
    }
    lVar4 = lVar3 * 0xdbd95b16 + 0x100000000 >> 0x20;
    lVar3 = -lVar4;
    if (-1 < local_38.x) {
      lVar3 = lVar4;
    }
    uVar5 = (ulong)(uint)((int)lVar3 << (-(byte)iVar8 & 0x1f));
    if (-1 < iVar8) {
      uVar5 = lVar3 >> ((byte)iVar8 & 0x3f);
    }
    *length = uVar5;
    *angle = local_38.y;
  }
  return;
}

Assistant:

void PVG_FT_Vector_Polarize(PVG_FT_Vector* vec, PVG_FT_Fixed* length,
    PVG_FT_Angle* angle)
{
    PVG_FT_Int    shift;
    PVG_FT_Vector v;

    v = *vec;

    if (v.x == 0 && v.y == 0) return;

    shift = ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    v.x = ft_trig_downscale(v.x);

    *length = (shift >= 0) ? (v.x >> shift)
                           : (PVG_FT_Fixed)((PVG_FT_UInt32)v.x << -shift);
    *angle = v.y;
}